

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O0

gpu_object * nvrm_get_fifo(gpu_object *obj,uint64_t gpu_addr,int strict)

{
  int iVar1;
  gpu_object *dev_00;
  nvrm_device *pnVar2;
  int local_44;
  int chipset;
  int fifos;
  gpu_object *dev;
  gpu_object *fifo;
  gpu_object *last;
  int strict_local;
  uint64_t gpu_addr_local;
  gpu_object *obj_local;
  
  fifo = (gpu_object *)0x0;
  gpu_addr_local = (uint64_t)obj;
  while( true ) {
    if (gpu_addr_local == 0) {
      return fifo;
    }
    iVar1 = is_fifo((gpu_object *)gpu_addr_local,0);
    if (iVar1 != 0) {
      fifo = (gpu_object *)gpu_addr_local;
    }
    iVar1 = is_fifo_and_addr_belongs((gpu_object *)gpu_addr_local,gpu_addr);
    if (iVar1 != 0) break;
    if (*(int *)(gpu_addr_local + 0x24) == 0x80) {
      dev = nvrm_find_object_by_func((gpu_object *)gpu_addr_local,is_fifo_and_addr_belongs,gpu_addr)
      ;
      if ((dev == (gpu_object *)0x0) && (strict == 0)) {
        dev = nvrm_find_object_by_func((gpu_object *)gpu_addr_local,is_fifo,0);
        dev_00 = nvrm_get_device((gpu_object *)gpu_addr_local);
        local_44 = 0;
        if ((dev_00 != (gpu_object *)0x0) && (dev_00->class_data != (void *)0x0)) {
          pnVar2 = nvrm_dev(dev_00);
          local_44 = pnVar2->fifos;
        }
        if ((1 < local_44) && (nvrm_get_fifo::warned == 0)) {
          iVar1 = nvrm_get_chipset(dev_00);
          if ((iVar1 < 0x81) && (iVar1 != 0x50)) {
            fprintf(_stdout,
                    "ERROR: This trace may not be decoded accurately because there are multiple fifo objects and USER buffer detection is not implemented yet%s\n"
                    ,"");
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
          }
          else {
            fprintf(_stdout,
                    "ERROR: This trace may not be decoded accurately because there are multiple fifo objects and ioctl_creates for some of them were not captured with argument data%s\n"
                    ,"");
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
          }
          nvrm_get_fifo::warned = 1;
        }
      }
      return dev;
    }
    gpu_addr_local = *(uint64_t *)(gpu_addr_local + 0x10);
  }
  return (gpu_object *)gpu_addr_local;
}

Assistant:

struct gpu_object *nvrm_get_fifo(struct gpu_object *obj, uint64_t gpu_addr, int strict)
{
	struct gpu_object *last = NULL;
	while (obj)
	{
		if (is_fifo(obj, 0))
			last = obj;
		if (is_fifo_and_addr_belongs(obj, gpu_addr))
			return obj;
		if (obj->class_ == NVRM_DEVICE_0)
		{
			struct gpu_object *fifo = nvrm_find_object_by_func(obj, is_fifo_and_addr_belongs, gpu_addr);
			if (!fifo && !strict) // fallback, for traces without ioctl_create args
			{
				fifo = nvrm_find_object_by_func(obj, is_fifo, 0);

				struct gpu_object *dev = nvrm_get_device(obj);
				int fifos = 0;
				if (dev && dev->class_data)
					fifos = nvrm_dev(dev)->fifos;

				static int warned = 0;
				if (fifos > 1 && !warned)
				{
					int chipset = nvrm_get_chipset(dev);
					if (chipset > 0x80 || chipset == 0x50)
						mmt_error("This trace may not be decoded accurately because there are multiple fifo objects "
								"and ioctl_creates for some of them were not captured with argument data%s\n", "");
					else
						mmt_error("This trace may not be decoded accurately because there are multiple fifo objects "
								"and USER buffer detection is not implemented yet%s\n", "");
					warned = 1;
				}
			}
			return fifo;
		}

		obj = obj->parent_object;
	}

	return last;
}